

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_change_stream_priority
              (nghttp2_session *session,int32_t stream_id,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  nghttp2_stream *stream;
  int iVar2;
  nghttp2_priority_spec pri_spec_copy;
  nghttp2_priority_spec local_38;
  
  iVar2 = 0;
  if (((session->pending_no_rfc7540_priorities != '\x01') && (iVar2 = -0x1f5, stream_id != 0)) &&
     (pri_spec->stream_id != stream_id)) {
    stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,stream_id);
    if (stream != (nghttp2_stream *)0x0) {
      local_38.exclusive = pri_spec->exclusive;
      local_38._9_3_ = *(undefined3 *)&pri_spec->field_0x9;
      local_38.stream_id = pri_spec->stream_id;
      local_38.weight = pri_spec->weight;
      nghttp2_priority_spec_normalize_weight(&local_38);
      iVar1 = nghttp2_session_reprioritize_stream(session,stream,&local_38);
      iVar2 = 0;
      if (iVar1 < -900) {
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_change_stream_priority(
  nghttp2_session *session, int32_t stream_id,
  const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec_copy;

  if (session->pending_no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  pri_spec_copy = *pri_spec;
  nghttp2_priority_spec_normalize_weight(&pri_spec_copy);

  rv = nghttp2_session_reprioritize_stream(session, stream, &pri_spec_copy);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  /* We don't intentionally call nghttp2_session_adjust_idle_stream()
     so that idle stream created by this function, and existing ones
     are kept for application.  We will adjust number of idle stream
     in nghttp2_session_mem_send2 or nghttp2_session_mem_recv2 is
     called. */
  return 0;
}